

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O1

void BCL::local_free<char>(GlobalPtr<char> *ptr)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  char *pcVar6;
  runtime_error *this;
  ulong *puVar7;
  
  if (bcl_finalized != '\0') {
    return;
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
  if (iVar5 == 0) {
    pcVar6 = GlobalPtr<char>::local(ptr);
    if (pcVar6 != (char *)0x0) {
      pcVar1 = pcVar6 + -0x40;
      puVar7 = (ulong *)&flist;
      do {
        pcVar2 = (char *)*puVar7;
        if (pcVar2 == (char *)0x0) break;
        puVar7 = (ulong *)(pcVar2 + 0x10);
      } while (pcVar1 <= pcVar2);
      if (pcVar2 == (char *)0x0) {
        puVar7 = (ulong *)&flist;
        *(long *)(pcVar6 + -0x30) = flist;
        pcVar6[-0x38] = '\0';
        pcVar6[-0x37] = '\0';
        pcVar6[-0x36] = '\0';
        pcVar6[-0x35] = '\0';
        pcVar6[-0x34] = '\0';
        pcVar6[-0x33] = '\0';
        pcVar6[-0x32] = '\0';
        pcVar6[-0x31] = '\0';
        if (flist != 0) {
          *(char **)(flist + 8) = pcVar1;
        }
      }
      else {
        if (pcVar1 <= pcVar2) goto LAB_00105c91;
        lVar3 = *(long *)(pcVar2 + 0x10);
        *(long *)(pcVar6 + -0x30) = lVar3;
        *(char **)(pcVar6 + -0x38) = pcVar2;
        if (lVar3 != 0) {
          *(char **)(lVar3 + 8) = pcVar1;
        }
        puVar7 = (ulong *)(*(long *)(pcVar6 + -0x38) + 0x10);
      }
      *puVar7 = (ulong)pcVar1;
      plVar4 = *(long **)(pcVar6 + -0x30);
      if (plVar4 == (long *)(pcVar6 + *(long *)(pcVar6 + -0x40))) {
        *(long *)(pcVar6 + -0x40) = *(long *)(pcVar6 + -0x40) + *plVar4 + 0x40;
        lVar3 = plVar4[2];
        *(long *)(pcVar6 + -0x30) = lVar3;
        if (lVar3 != 0) {
          *(char **)(lVar3 + 8) = pcVar1;
        }
      }
      plVar4 = *(long **)(pcVar6 + -0x38);
      if ((plVar4 != (long *)0x0) &&
         (pcVar1 == (char *)plVar4[2] &&
          (char *)((long)plVar4 + *plVar4 + 0x40) == (char *)plVar4[2])) {
        *plVar4 = *(long *)(pcVar6 + -0x40) + *plVar4 + 0x40;
        lVar3 = *(long *)(pcVar6 + -0x30);
        plVar4[2] = lVar3;
        if (lVar3 != 0) {
          *(long **)(lVar3 + 8) = plVar4;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
    return;
  }
  std::__throw_system_error(iVar5);
LAB_00105c91:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"AGH!!!! What a world, what a world! This was never supposed to happen.\n");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void local_free(const GlobalPtr <T> &ptr) {
  if (bcl_finalized) {
    return;
  }
  BCL::malloc_mutex.lock();
  char *vptr = (char *) ptr.local();

  if (vptr == nullptr) {
    BCL::malloc_mutex.unlock();
    return;
  }

  chunk_t *my_chunk = (chunk_t *) (vptr - chunk_t_size());
  chunk_t *neighbor_chunk = flist;

  // Keep free list in order to
  // make compaction easy
  while (neighbor_chunk != NULL) {
    if (my_chunk > neighbor_chunk) {
      break;
    }
    neighbor_chunk = neighbor_chunk->next;
  }

  // I am the primordial chunk.
  if (neighbor_chunk == NULL) {
    my_chunk->next = flist;
    my_chunk->last = NULL;
    if (flist != NULL) {
      flist->last = my_chunk;
    }
    flist = my_chunk;
  } else {
    if (my_chunk > neighbor_chunk) {
      my_chunk->next = neighbor_chunk->next;
      my_chunk->last = neighbor_chunk;
      if (my_chunk->next != NULL) {
        my_chunk->next->last = my_chunk;
      }
      my_chunk->last->next = my_chunk;
    } else {
      throw std::runtime_error("AGH!!!! What a world, what a world! This was never supposed to happen.\n");
      // TODO: there's a bug here--the "primordial chunk" can be lost.
      my_chunk->next = neighbor_chunk;
      my_chunk->last = neighbor_chunk->last;
      my_chunk->next->last = my_chunk;
      if (my_chunk->last != NULL) {
        my_chunk->last->next = my_chunk;
      }
      if (flist == neighbor_chunk) {
        flist = my_chunk;
      }
    }
  }

  // Compact!

  // If chunk directly after is free, compact.
  if ((char *) my_chunk->next == ((char *) my_chunk) + chunk_t_size() + my_chunk->size) {
    my_chunk->size += chunk_t_size() + my_chunk->next->size;
    my_chunk->next = my_chunk->next->next;
    if (my_chunk->next != NULL) {
      my_chunk->next->last = my_chunk;
    }
  }

  // If chunk directly before is free, compact.
  if (my_chunk->last != NULL &&
    (char *) my_chunk->last->next == ((char *) my_chunk->last) + chunk_t_size() + my_chunk->last->size &&
    my_chunk->last->next == my_chunk) {
      my_chunk->last->size += chunk_t_size() + my_chunk->size;
      my_chunk->last->next = my_chunk->next;
      if (my_chunk->last->next != NULL) {
        my_chunk->last->next->last = my_chunk->last;
      }
  }
  BCL::malloc_mutex.unlock();
}